

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
::find_impl<int>(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                 *this,key_arg<int> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  int iVar2;
  ctrl_t *pcVar3;
  slot_type *psVar4;
  uint uVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  __m128i match;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  probe_seq<16UL> seq;
  probe_seq<16UL> local_40;
  char cVar28;
  char cVar30;
  char cVar31;
  char cVar32;
  
  if (this->ctrl_ == (ctrl_t *)0x0) {
    return false;
  }
  probe(&local_40,this,hashval);
  pcVar3 = this->ctrl_;
  psVar4 = this->slots_;
  auVar26 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar26 = pshuflw(auVar26,auVar26,0);
  iVar2 = *key;
  do {
    pcVar1 = pcVar3 + local_40.offset_;
    cVar6 = *pcVar1;
    cVar7 = pcVar1[1];
    cVar8 = pcVar1[2];
    cVar9 = pcVar1[3];
    cVar10 = pcVar1[4];
    cVar11 = pcVar1[5];
    cVar12 = pcVar1[6];
    cVar13 = pcVar1[7];
    cVar14 = pcVar1[8];
    cVar15 = pcVar1[9];
    cVar16 = pcVar1[10];
    cVar17 = pcVar1[0xb];
    cVar18 = pcVar1[0xc];
    cVar19 = pcVar1[0xd];
    cVar20 = pcVar1[0xe];
    cVar21 = pcVar1[0xf];
    cVar28 = auVar26[0];
    auVar29[0] = -(cVar28 == cVar6);
    cVar30 = auVar26[1];
    auVar29[1] = -(cVar30 == cVar7);
    cVar31 = auVar26[2];
    auVar29[2] = -(cVar31 == cVar8);
    cVar32 = auVar26[3];
    auVar29[3] = -(cVar32 == cVar9);
    auVar29[4] = -(cVar28 == cVar10);
    auVar29[5] = -(cVar30 == cVar11);
    auVar29[6] = -(cVar31 == cVar12);
    auVar29[7] = -(cVar32 == cVar13);
    auVar29[8] = -(cVar28 == cVar14);
    auVar29[9] = -(cVar30 == cVar15);
    auVar29[10] = -(cVar31 == cVar16);
    auVar29[0xb] = -(cVar32 == cVar17);
    auVar29[0xc] = -(cVar28 == cVar18);
    auVar29[0xd] = -(cVar30 == cVar19);
    auVar29[0xe] = -(cVar31 == cVar20);
    auVar29[0xf] = -(cVar32 == cVar21);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar29[0xf] >> 7) << 0xf); bVar25 = uVar22 != 0, bVar25;
        uVar22 = uVar22 - 1 & uVar22) {
      uVar5 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar24 = uVar5 + local_40.offset_ & local_40.mask_;
      *offset = uVar24;
      if (psVar4[uVar24].value.first == iVar2) {
        return bVar25;
      }
    }
    auVar27[0] = -(cVar6 == -0x80);
    auVar27[1] = -(cVar7 == -0x80);
    auVar27[2] = -(cVar8 == -0x80);
    auVar27[3] = -(cVar9 == -0x80);
    auVar27[4] = -(cVar10 == -0x80);
    auVar27[5] = -(cVar11 == -0x80);
    auVar27[6] = -(cVar12 == -0x80);
    auVar27[7] = -(cVar13 == -0x80);
    auVar27[8] = -(cVar14 == -0x80);
    auVar27[9] = -(cVar15 == -0x80);
    auVar27[10] = -(cVar16 == -0x80);
    auVar27[0xb] = -(cVar17 == -0x80);
    auVar27[0xc] = -(cVar18 == -0x80);
    auVar27[0xd] = -(cVar19 == -0x80);
    auVar27[0xe] = -(cVar20 == -0x80);
    auVar27[0xf] = -(cVar21 == -0x80);
    if ((((((((((((((((auVar27 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar27 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar27 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar27 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar27 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar27 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar27 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar27 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar27 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar27 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar21 == -0x80) {
      return bVar25;
    }
    lVar23 = local_40.offset_ + local_40.index_;
    local_40.index_ = local_40.index_ + 0x10;
    local_40.offset_ = lVar23 + 0x10U & local_40.mask_;
  } while( true );
}

Assistant:

bool find_impl(const key_arg<K>& PHMAP_RESTRICT key, size_t hashval, size_t& PHMAP_RESTRICT offset) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ ctrl_ + seq.offset() };
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                offset = seq.offset((size_t)i);
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                    EqualElement<K>{key, eq_ref()},
                    PolicyTraits::element(slots_ + offset))))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
                return false;
            seq.next();
        }
    }